

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_stream_impl<wchar_t>
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options,
          xml_encoding encoding,char_t **out_buffer)

{
  size_t contents;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *doc_00;
  xml_encoding encoding_00;
  ulong uVar1;
  streamoff sVar2;
  size_t size_00;
  fpos afStack_50 [4];
  xml_encoding real_encoding;
  undefined8 local_48;
  xml_parse_status local_3c;
  size_t sStack_38;
  xml_parse_status status;
  size_t size;
  void *buffer;
  char_t **out_buffer_local;
  xml_encoding encoding_local;
  uint options_local;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream_local;
  xml_document_struct *doc_local;
  
  size = 0;
  sStack_38 = 0;
  local_3c = 0;
  buffer = out_buffer;
  out_buffer_local._0_4_ = encoding;
  out_buffer_local._4_4_ = options;
  _encoding_local = stream;
  stream_local = (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)doc;
  uVar1 = std::wios::fail();
  if ((uVar1 & 1) == 0) {
    _afStack_50 = std::wistream::tellg();
    sVar2 = std::fpos::operator_cast_to_long(afStack_50);
    if (sVar2 < 0) {
      std::wios::clear((int)_encoding_local + (int)*(undefined8 *)(*(long *)_encoding_local + -0x18)
                      );
      local_3c = load_stream_data_noseek<wchar_t>
                           (_encoding_local,(void **)&size,&stack0xffffffffffffffc8);
    }
    else {
      local_3c = load_stream_data_seek<wchar_t>
                           (_encoding_local,(void **)&size,&stack0xffffffffffffffc8);
    }
    if (local_3c == status_ok) {
      encoding_00 = get_buffer_encoding((xml_encoding)out_buffer_local,(void *)size,sStack_38);
      doc_00 = stream_local;
      contents = size;
      size_00 = zero_terminate_buffer((void *)size,sStack_38,encoding_00);
      load_buffer_impl(__return_storage_ptr__,(xml_document_struct *)doc_00,
                       (xml_node_struct *)doc_00,(void *)contents,size_00,out_buffer_local._4_4_,
                       encoding_00,true,true,(char_t **)buffer);
    }
    else {
      make_parse_result(__return_storage_ptr__,local_3c,0);
    }
  }
  else {
    make_parse_result(__return_storage_ptr__,status_io_error,0);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_stream_impl(xml_document_struct* doc, std::basic_istream<T>& stream, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		void* buffer = 0;
		size_t size = 0;
		xml_parse_status status = status_ok;

		// if stream has an error bit set, bail out (otherwise tellg() can fail and we'll clear error bits)
		if (stream.fail()) return make_parse_result(status_io_error);

		// load stream to memory (using seek-based implementation if possible, since it's faster and takes less memory)
		if (stream.tellg() < 0)
		{
			stream.clear(); // clear error flags that could be set by a failing tellg
			status = load_stream_data_noseek(stream, &buffer, &size);
		}
		else
			status = load_stream_data_seek(stream, &buffer, &size);

		if (status != status_ok) return make_parse_result(status);

		xml_encoding real_encoding = get_buffer_encoding(encoding, buffer, size);

		return load_buffer_impl(doc, doc, buffer, zero_terminate_buffer(buffer, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}